

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

void anon_unknown.dwarf_10db0::cmakemainMessageCallback(string *m,cmMessageMetadata *md,cmake *cm)

{
  int color;
  FILE *stream;
  undefined8 uVar1;
  ostream *poVar2;
  cmake *cm_00;
  string local_40;
  cmake *local_20;
  cmake *cm_local;
  cmMessageMetadata *md_local;
  string *m_local;
  
  stream = _stderr;
  color = md->desiredColor;
  local_20 = cm;
  cm_local = (cmake *)md;
  md_local = (cmMessageMetadata *)m;
  uVar1 = std::__cxx11::string::c_str();
  cmsysTerminal_cfprintf(color,(FILE *)stream,"%s",uVar1);
  fflush(_stderr);
  (anonymous_namespace)::cmakemainGetStack_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)local_20,cm_00);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,'\n');
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmakemainMessageCallback(const std::string& m,
                              const cmMessageMetadata& md, cmake* cm)
{
#if defined(_WIN32)
  // FIXME: On Windows we replace cerr's streambuf with a custom
  // implementation that converts our internal UTF-8 encoding to the
  // console's encoding.  It also does *not* replace LF with CRLF.
  // Since stderr does not convert encoding and does convert LF, we
  // cannot use it to print messages.  Another implementation will
  // be needed to print colored messages on Windows.
  static_cast<void>(md);
  std::cerr << m << cmakemainGetStack(cm) << '\n' << std::flush;
#else
  cmsysTerminal_cfprintf(md.desiredColor, stderr, "%s", m.c_str());
  fflush(stderr); // stderr is buffered in some cases.
  std::cerr << cmakemainGetStack(cm) << '\n' << std::flush;
#endif
}